

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O1

bool __thiscall ON_Light::Write(ON_Light *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,2);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bOn);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_style);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_intensity);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_watts);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_ambient);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_diffuse);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_specular);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteVector(file,&this->m_direction);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WritePoint(file,&this->m_location);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_spot_angle);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_spot_exponent);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteVector(file,&this->m_attenuation);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_shadow_intensity);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,RenderLight,this->m_light_index)
    ;
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_light_id);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteString(file,&this->m_light_name);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteVector(file,&this->m_length);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteVector(file,&this->m_width);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_hotspot);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_Light::Write(
       ON_BinaryArchive& file
     ) const
{
  int i;
  bool rc = file.Write3dmChunkVersion(1,2);
  // version 1.0 fields
  if ( rc ) rc = file.WriteInt( m_bOn?1:0 );
  i = m_style;
  if ( rc ) rc = file.WriteInt( i );
  if ( rc ) rc = file.WriteDouble( m_intensity );
  if ( rc ) rc = file.WriteDouble( m_watts );
  if ( rc ) rc = file.WriteColor( m_ambient );
  if ( rc ) rc = file.WriteColor( m_diffuse );
  if ( rc ) rc = file.WriteColor( m_specular );
  if ( rc ) rc = file.WriteVector( m_direction );
  if ( rc ) rc = file.WritePoint( m_location );
  if ( rc ) rc = file.WriteDouble( m_spot_angle );
  if ( rc ) rc = file.WriteDouble( m_spot_exponent );
  if ( rc ) rc = file.WriteVector( m_attenuation );
  if ( rc ) rc = file.WriteDouble( m_shadow_intensity );
  if ( rc ) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderLight, m_light_index );
  if ( rc ) rc = file.WriteUuid( m_light_id );
  if ( rc ) rc = file.WriteString( m_light_name );
  // version 1.1 added support for linear and rectangular
  if ( rc ) rc = file.WriteVector( m_length );
  if ( rc ) rc = file.WriteVector( m_width );
  // version 1.2 added m_hotspot support
  if ( rc ) rc = file.WriteDouble( m_hotspot );
  return rc;
}